

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-eval-util.hh
# Opt level: O1

vector<float,_std::allocator<float>_> *
tinyusdz::lerp<float>
          (vector<float,_std::allocator<float>_> *__return_storage_ptr__,
          vector<float,_std::allocator<float>_> *a,vector<float,_std::allocator<float>_> *b,double t
          )

{
  pointer pfVar1;
  pointer pfVar2;
  pointer pfVar3;
  ulong uVar4;
  size_type sVar5;
  ulong __new_size;
  
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar4 = (long)(a->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(a->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_start >> 2;
  __new_size = (long)(b->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(b->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 2;
  if (uVar4 <= __new_size) {
    __new_size = uVar4;
  }
  if (__new_size != 0) {
    ::std::vector<float,_std::allocator<float>_>::resize(__return_storage_ptr__,__new_size);
    pfVar1 = (a->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    pfVar2 = (b->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    if ((long)(a->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
              ._M_finish - (long)pfVar1 ==
        (long)(b->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
              ._M_finish - (long)pfVar2) {
      pfVar3 = (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      sVar5 = 0;
      do {
        pfVar3[sVar5] = pfVar1[sVar5] * (float)(1.0 - t) + pfVar2[sVar5] * (float)t;
        sVar5 = sVar5 + 1;
      } while (__new_size != sVar5);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<T> lerp(const std::vector<T> &a, const std::vector<T> &b,
                           const double t) {
  std::vector<T> dst;

  // Choose shorter one
  size_t n = std::min(a.size(), b.size());
  if (n == 0) {
    return dst;
  }

  dst.resize(n);

  if (a.size() != b.size()) {
    return dst;
  }
  for (size_t i = 0; i < n; i++) {
    dst[i] = lerp(a[i], b[i], t);
  }

  return dst;
}